

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O0

bool chaiscript::dispatch::detail::
     call_func<chaiscript::dispatch::detail::Fun_Caller<bool,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&>,bool,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&,0ul>
               (undefined8 param_1,
               shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base> *param_2,
               vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *param_3,
               undefined8 param_4)

{
  bool bVar1;
  Type_Conversions_State *in_stack_000000b0;
  Boxed_Value *in_stack_000000b8;
  Fun_Caller<bool,_const_std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_&> *this;
  Fun_Caller<bool,_const_std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_&>
  local_38 [2];
  undefined8 local_28;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *local_20;
  shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base> *local_18;
  undefined8 local_10;
  
  local_28 = param_4;
  local_20 = param_3;
  local_18 = param_2;
  local_10 = param_1;
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::operator[]
            (param_3,0);
  this = local_38;
  boxed_cast<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&>
            (in_stack_000000b8,in_stack_000000b0);
  bVar1 = Fun_Caller<bool,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&>::
          operator()(this,param_2);
  std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base> *)0x37c3c4);
  return bVar1;
}

Assistant:

Ret call_func(const chaiscript::dispatch::detail::Function_Signature<Ret (Params...)> &, Indexes<I...>, const Callable &f,
            const std::vector<Boxed_Value> &params, const Type_Conversions_State &t_conversions)
        {
          (void)params; (void)t_conversions;
          return f(boxed_cast<Params>(params[I], &t_conversions)...);
        }